

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary_element.cpp
# Opt level: O2

void __thiscall BoundaryElement::upward_pass(BoundaryElement *this)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  Timers_BoundaryElement *pTVar4;
  Elements *pEVar5;
  InterpolationPoints *pIVar6;
  BoundaryElement *pBVar7;
  rep rVar8;
  ulong uVar9;
  unsigned_long uVar10;
  ulong uVar11;
  long lVar12;
  int k3;
  ulong uVar13;
  long lVar14;
  size_t i;
  size_type sVar15;
  int iVar16;
  size_type __n;
  int k2;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  array<unsigned_long,_2UL> aVar28;
  vector<int,_std::allocator<int>_> exact_idx_x;
  vector<int,_std::allocator<int>_> exact_idx_z;
  vector<int,_std::allocator<int>_> exact_idx_y;
  vector<double,_std::allocator<double>_> denominator;
  vector<double,_std::allocator<double>_> weights;
  allocator_type local_1a1;
  long local_1a0;
  pointer local_198;
  int local_18c;
  long local_188;
  pointer local_180;
  pointer local_178;
  pointer local_170;
  ulong local_168;
  pointer local_160;
  pointer local_158;
  pointer local_150;
  ulong local_148;
  ulong local_140;
  pointer local_138;
  pointer local_130;
  pointer local_128;
  pointer local_120;
  BoundaryElement *local_118;
  long local_110;
  long local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  pointer local_d0;
  long local_c8;
  pointer local_c0;
  pointer local_b8;
  pointer local_b0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pTVar4 = this->timers_;
  rVar8 = std::chrono::_V2::steady_clock::now();
  (pTVar4->upward_pass).start_time_.__d.__r = rVar8;
  pEVar5 = this->elements_;
  pIVar6 = this->interp_pts_;
  local_170 = (pIVar6->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_178 = (pIVar6->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_180 = (pIVar6->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_e8 = (this->interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f0 = (this->interp_charge_dx_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f8 = (this->interp_charge_dy_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (this->interp_charge_dz_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_150 = (pEVar5->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_158 = (pEVar5->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_160 = (pEVar5->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_120 = (pEVar5->source_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = (pEVar5->source_charge_dx_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_130 = (pEVar5->source_charge_dy_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_138 = (pEVar5->source_charge_dz_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)pIVar6->num_interp_pts_per_node_,(allocator_type *)&local_a8);
  local_198 = local_48._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_48._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar16 = (int)uVar9;
  uVar11 = 0;
  uVar9 = uVar9 & 0xffffffff;
  if (iVar16 < 1) {
    uVar9 = uVar11;
  }
  for (; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    dVar20 = *(double *)(&DAT_00115860 + (ulong)((uVar11 & 1) == 0) * 8) * 0.5;
    dVar19 = dVar20;
    if (iVar16 - 1 != uVar11) {
      dVar19 = *(double *)(&DAT_00115860 + (ulong)((uVar11 & 1) == 0) * 8);
    }
    if (uVar11 != 0) {
      dVar20 = dVar19;
    }
    local_48._M_impl.super__Vector_impl_data._M_start[uVar11] = dVar20;
  }
  uVar3 = this->interp_pts_->num_interp_pts_per_node_;
  local_140 = (ulong)uVar3;
  local_18c = uVar3 * uVar3;
  local_188 = 0;
  local_148 = 0;
  if (0 < (int)uVar3) {
    local_148 = (ulong)uVar3;
  }
  local_110 = (long)(int)uVar3;
  uVar9 = 0;
  local_118 = this;
  while (pBVar7 = local_118, uVar9 < local_118->tree_->num_nodes_) {
    local_168 = uVar9;
    aVar28 = Tree::node_particle_idxs(local_118->tree_,uVar9);
    uVar10 = aVar28._M_elems[0];
    lVar12 = (long)pBVar7->interp_pts_->num_interp_pts_per_node_;
    local_1a0 = (long)pBVar7->num_charges_per_node_;
    __n = aVar28._M_elems[1] - uVar10;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_a8,__n,(allocator_type *)&local_78);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_78,__n,(allocator_type *)&local_90);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_90,__n,(allocator_type *)&local_60);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,__n,&local_1a1);
    lVar14 = local_168 * lVar12;
    local_1a0 = local_1a0 * local_168;
    for (sVar15 = 0; __n != sVar15; sVar15 = sVar15 + 1) {
      local_a8._M_impl.super__Vector_impl_data._M_start[sVar15] = -1;
      local_78._M_impl.super__Vector_impl_data._M_start[sVar15] = -1;
      local_90._M_impl.super__Vector_impl_data._M_start[sVar15] = -1;
    }
    lVar12 = lVar12 * local_188;
    for (sVar15 = 0; sVar15 != __n; sVar15 = sVar15 + 1) {
      lVar1 = sVar15 + uVar10;
      dVar20 = local_160[lVar1];
      dVar19 = local_158[lVar1];
      dVar22 = local_150[lVar1];
      dVar17 = 0.0;
      dVar18 = 0.0;
      dVar21 = 0.0;
      for (uVar9 = 0; local_148 != uVar9; uVar9 = uVar9 + 1) {
        dVar25 = dVar22 - *(double *)((long)local_170 + uVar9 * 8 + lVar12);
        dVar2 = local_198[uVar9];
        dVar26 = *(double *)((long)local_180 + uVar9 * 8 + lVar12);
        dVar27 = *(double *)((long)local_178 + uVar9 * 8 + lVar12);
        iVar16 = (int)uVar9;
        if (ABS(dVar25) < 2.2250738585072014e-308) {
          local_a8._M_impl.super__Vector_impl_data._M_start[sVar15] = iVar16;
        }
        dVar26 = dVar20 - dVar26;
        dVar27 = dVar19 - dVar27;
        if (ABS(dVar27) < 2.2250738585072014e-308) {
          local_78._M_impl.super__Vector_impl_data._M_start[sVar15] = iVar16;
        }
        if (ABS(dVar26) < 2.2250738585072014e-308) {
          local_90._M_impl.super__Vector_impl_data._M_start[sVar15] = iVar16;
        }
        dVar21 = dVar21 + dVar2 / dVar25;
        auVar23._8_8_ = dVar2;
        auVar23._0_8_ = dVar2;
        auVar24._8_8_ = dVar27;
        auVar24._0_8_ = dVar26;
        auVar24 = divpd(auVar23,auVar24);
        dVar17 = dVar17 + auVar24._0_8_;
        dVar18 = dVar18 + auVar24._8_8_;
      }
      local_60._M_impl.super__Vector_impl_data._M_start[sVar15] = 1.0;
      dVar20 = 1.0;
      if (local_a8._M_impl.super__Vector_impl_data._M_start[sVar15] == -1) {
        dVar20 = 1.0 / dVar21;
        local_60._M_impl.super__Vector_impl_data._M_start[sVar15] = dVar20;
      }
      if (local_78._M_impl.super__Vector_impl_data._M_start[sVar15] == -1) {
        dVar20 = dVar20 / dVar18;
        local_60._M_impl.super__Vector_impl_data._M_start[sVar15] = dVar20;
      }
      if (local_90._M_impl.super__Vector_impl_data._M_start[sVar15] == -1) {
        local_60._M_impl.super__Vector_impl_data._M_start[sVar15] = dVar20 / dVar17;
      }
    }
    local_d0 = local_170 + lVar14;
    local_d8 = local_178 + lVar14;
    local_e0 = local_180 + lVar14;
    local_b0 = local_160 + uVar10;
    local_b8 = local_158 + uVar10;
    local_c0 = local_150 + uVar10;
    for (uVar9 = 0; uVar9 != local_148; uVar9 = uVar9 + 1) {
      local_108 = local_18c * (int)uVar9 + local_1a0;
      for (uVar11 = 0; uVar11 != local_140; uVar11 = uVar11 + 1) {
        local_c8 = uVar11 * local_110 + local_108;
        for (uVar13 = 0; uVar13 != local_140; uVar13 = uVar13 + 1) {
          dVar22 = 0.0;
          dVar17 = 0.0;
          dVar20 = 0.0;
          dVar19 = 0.0;
          for (sVar15 = 0; __n != sVar15; sVar15 = sVar15 + 1) {
            if ((ulong)(uint)local_a8._M_impl.super__Vector_impl_data._M_start[sVar15] == 0xffffffff
               ) {
              dVar18 = local_198[uVar9] / (local_c0[sVar15] - local_d0[uVar9]);
            }
            else {
              dVar18 = 1.0;
              if (uVar9 != (uint)local_a8._M_impl.super__Vector_impl_data._M_start[sVar15]) {
                dVar18 = 0.0;
              }
            }
            if ((ulong)(uint)local_78._M_impl.super__Vector_impl_data._M_start[sVar15] == 0xffffffff
               ) {
              dVar18 = dVar18 * (local_198[uVar11] / (local_b8[sVar15] - local_d8[uVar11]));
            }
            else if (uVar11 != (uint)local_78._M_impl.super__Vector_impl_data._M_start[sVar15]) {
              dVar18 = dVar18 * 0.0;
            }
            if ((ulong)(uint)local_90._M_impl.super__Vector_impl_data._M_start[sVar15] == 0xffffffff
               ) {
              dVar18 = dVar18 * (local_198[uVar13] / (local_b0[sVar15] - local_e0[uVar13]));
            }
            else if (uVar13 != (uint)local_90._M_impl.super__Vector_impl_data._M_start[sVar15]) {
              dVar18 = dVar18 * 0.0;
            }
            dVar21 = local_60._M_impl.super__Vector_impl_data._M_start[sVar15];
            dVar20 = dVar20 + local_130[uVar10 + sVar15] * dVar18 * dVar21;
            dVar19 = dVar19 + local_138[uVar10 + sVar15] * dVar18 * dVar21;
            dVar22 = dVar22 + dVar21 * local_120[uVar10 + sVar15] * dVar18;
            dVar17 = dVar17 + dVar21 * local_128[uVar10 + sVar15] * dVar18;
          }
          lVar12 = local_c8 + uVar13;
          local_e8[lVar12] = local_e8[lVar12] + dVar22;
          local_f0[lVar12] = dVar17 + local_f0[lVar12];
          local_f8[lVar12] = local_f8[lVar12] + dVar20;
          local_100[lVar12] = dVar19 + local_100[lVar12];
        }
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    local_188 = local_188 + 8;
    uVar9 = local_168 + 1;
  }
  Timer::stop(&local_118->timers_->upward_pass);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void BoundaryElement::upward_pass()
{
    timers_.upward_pass.start();

    const double* __restrict clusters_x_ptr   = interp_pts_.interp_x_ptr();
    const double* __restrict clusters_y_ptr   = interp_pts_.interp_y_ptr();
    const double* __restrict clusters_z_ptr   = interp_pts_.interp_z_ptr();
    
    double* __restrict clusters_q_ptr         = interp_charge_.data();
    double* __restrict clusters_q_dx_ptr      = interp_charge_dx_.data();
    double* __restrict clusters_q_dy_ptr      = interp_charge_dy_.data();
    double* __restrict clusters_q_dz_ptr      = interp_charge_dz_.data();
    
    const double* __restrict elements_x_ptr  = elements_.x_ptr();
    const double* __restrict elements_y_ptr  = elements_.y_ptr();
    const double* __restrict elements_z_ptr  = elements_.z_ptr();
    
    const double* __restrict sources_q_ptr    = elements_.source_charge_ptr();
    const double* __restrict sources_q_dx_ptr = elements_.source_charge_dx_ptr();
    const double* __restrict sources_q_dy_ptr = elements_.source_charge_dy_ptr();
    const double* __restrict sources_q_dz_ptr = elements_.source_charge_dz_ptr();
        
    std::vector<double> weights (interp_pts_.num_interp_pts_per_node());
    double* weights_ptr = weights.data();
    int weights_num = weights.size();
    
    for (int i = 0; i < weights_num; ++i) {
        weights[i] = ((i % 2 == 0)? 1 : -1);
        if (i == 0 || i == weights_num-1) weights[i] = ((i % 2 == 0)? 1 : -1) * 0.5;
    }

    int num_interp_pts_per_node = interp_pts_.num_interp_pts_per_node();
    
#ifdef OPENACC_ENABLED
    #pragma acc enter data copyin(weights_ptr[0:weights_num])
#endif
    
    for (std::size_t node_idx = 0; node_idx < tree_.num_nodes(); ++node_idx) {
        
        auto particle_idxs = tree_.node_particle_idxs(node_idx);
        
        std::size_t node_interp_pts_start = node_idx * interp_pts_.num_interp_pts_per_node();
        std::size_t node_charges_start    = node_idx * num_charges_per_node_;
        
        std::size_t particle_start = particle_idxs[0];
        std::size_t num_particles  = particle_idxs[1] - particle_idxs[0];
        
        std::vector<int> exact_idx_x(num_particles);
        std::vector<int> exact_idx_y(num_particles);
        std::vector<int> exact_idx_z(num_particles);
        std::vector<double> denominator(num_particles);
        
        int* exact_idx_x_ptr = exact_idx_x.data();
        int* exact_idx_y_ptr = exact_idx_y.data();
        int* exact_idx_z_ptr = exact_idx_z.data();
        double* denominator_ptr = denominator.data();
        
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc kernels present(elements_x_ptr, elements_y_ptr, elements_z_ptr, \
                         sources_q_ptr, sources_q_dx_ptr, sources_q_dy_ptr, sources_q_dz_ptr, \
                         clusters_x_ptr, clusters_y_ptr, clusters_z_ptr, \
                         clusters_q_ptr, clusters_q_dx_ptr, clusters_q_dy_ptr, clusters_q_dz_ptr, \
                         weights_ptr) \
                  create(exact_idx_x_ptr[0:num_particles], exact_idx_y_ptr[0:num_particles], \
                         exact_idx_z_ptr[0:num_particles], denominator_ptr[0:num_particles])
#endif
        {

#ifdef OPENACC_ENABLED
        #pragma acc loop vector(32) independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
            exact_idx_x_ptr[i] = -1;
            exact_idx_y_ptr[i] = -1;
            exact_idx_z_ptr[i] = -1;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop independent
#endif
        for (std::size_t i = 0; i < num_particles; ++i) {
        
            double denominator_x = 0.;
            double denominator_y = 0.;
            double denominator_z = 0.;
            
            double xx    = elements_x_ptr[particle_start + i];
            double yy    = elements_y_ptr[particle_start + i];
            double zz    = elements_z_ptr[particle_start + i];

            // because there's a reduction over exact_idx[i], this loop carries a
            // backward dependence and won't actually parallelize
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:denominator_x,denominator_y,denominator_z)
#endif
            for (int j = 0; j < num_interp_pts_per_node; ++j) {
            
                double dist_x = xx - clusters_x_ptr[node_interp_pts_start + j];
                double dist_y = yy - clusters_y_ptr[node_interp_pts_start + j];
                double dist_z = zz - clusters_z_ptr[node_interp_pts_start + j];
                
                denominator_x += weights_ptr[j] / dist_x;
                denominator_y += weights_ptr[j] / dist_y;
                denominator_z += weights_ptr[j] / dist_z;
                
                if (std::abs(dist_x) < std::numeric_limits<double>::min()) exact_idx_x_ptr[i] = j;
                if (std::abs(dist_y) < std::numeric_limits<double>::min()) exact_idx_y_ptr[i] = j;
                if (std::abs(dist_z) < std::numeric_limits<double>::min()) exact_idx_z_ptr[i] = j;
            }
            
            denominator_ptr[i] = 1.0;
            if (exact_idx_x_ptr[i] == -1) denominator_ptr[i] /= denominator_x;
            if (exact_idx_y_ptr[i] == -1) denominator_ptr[i] /= denominator_y;
            if (exact_idx_z_ptr[i] == -1) denominator_ptr[i] /= denominator_z;
        }

#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) independent
#endif
        for (int k1 = 0; k1 < num_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_interp_pts_per_node; ++k3) {
        
            std::size_t kk = node_charges_start
                   + k1 * num_interp_pts_per_node * num_interp_pts_per_node
                   + k2 * num_interp_pts_per_node + k3;
                   
            double cx = clusters_x_ptr[node_interp_pts_start + k1];
            double w1 = weights_ptr[k1];

            double cy = clusters_y_ptr[node_interp_pts_start + k2];
            double w2 = weights_ptr[k2];
            
            double cz = clusters_z_ptr[node_interp_pts_start + k3];
            double w3 = weights_ptr[k3];
            
            double q_temp    = 0.;
            double q_dx_temp = 0.;
            double q_dy_temp = 0.;
            double q_dz_temp = 0.;
            
#ifdef OPENACC_ENABLED
            #pragma acc loop reduction(+:q_temp,q_dx_temp,q_dy_temp,q_dz_temp)
#endif
            for (std::size_t i = 0; i < num_particles; i++) {  // loop over source points
            
                double dist_x = elements_x_ptr[particle_start + i] - cx;
                double dist_y = elements_y_ptr[particle_start + i] - cy;
                double dist_z = elements_z_ptr[particle_start + i] - cz;
                
                double numerator = 1.;

                // If exact_idx[i] == -1, then no issues.
                // If exact_idx[i] != -1, then we want to zero out terms EXCEPT when exactInd=k1.
                if (exact_idx_x_ptr[i] == -1) {
                    numerator *= w1 / dist_x;
                } else {
                    if (exact_idx_x_ptr[i] != k1) numerator *= 0.;
                }

                if (exact_idx_y_ptr[i] == -1) {
                    numerator *= w2 / dist_y;
                } else {
                    if (exact_idx_y_ptr[i] != k2) numerator *= 0.;
                }

                if (exact_idx_z_ptr[i] == -1) {
                    numerator *= w3 / dist_z;
                } else {
                    if (exact_idx_z_ptr[i] != k3) numerator *= 0.;
                }

                q_temp    += sources_q_ptr   [particle_start + i] * numerator * denominator_ptr[i];
                q_dx_temp += sources_q_dx_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dy_temp += sources_q_dy_ptr[particle_start + i] * numerator * denominator_ptr[i];
                q_dz_temp += sources_q_dz_ptr[particle_start + i] * numerator * denominator_ptr[i];
            }
            
            clusters_q_ptr   [kk] += q_temp;
            clusters_q_dx_ptr[kk] += q_dx_temp;
            clusters_q_dy_ptr[kk] += q_dy_temp;
            clusters_q_dz_ptr[kk] += q_dz_temp;
        }
        }
        }
        
        } // end parallel region
    } // end loop over nodes
#ifdef OPENACC_ENABLED
    #pragma acc exit data delete(weights_ptr[0:weights_num])
#endif

    timers_.upward_pass.stop();
}